

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_inv_txfm2d_add_universe_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined1 in_CL;
  TX_SIZE in_stack_00000093;
  int in_stack_00000094;
  uint8_t *in_stack_00000098;
  int32_t *in_stack_000000a0;
  int in_stack_000004cc;
  TX_SIZE in_stack_000004d2;
  TX_TYPE in_stack_000004d3;
  int in_stack_000004d4;
  uint8_t *in_stack_000004d8;
  int32_t *in_stack_000004e0;
  int in_stack_000008cc;
  TX_SIZE in_stack_000008d2;
  TX_TYPE in_stack_000008d3;
  int in_stack_000008d4;
  uint8_t *in_stack_000008d8;
  int32_t *in_stack_000008e0;
  int in_stack_000024dc;
  TX_SIZE in_stack_000024e2;
  TX_TYPE in_stack_000024e3;
  int in_stack_000024e4;
  uint8_t *in_stack_000024e8;
  int32_t *in_stack_000024f0;
  
  switch(in_CL) {
  case 0:
    lowbd_inv_txfm2d_add_no_identity_ssse3
              (in_stack_000024f0,in_stack_000024e8,in_stack_000024e4,in_stack_000024e3,
               in_stack_000024e2,in_stack_000024dc);
    break;
  default:
    lowbd_inv_txfm2d_add_no_identity_ssse3
              (in_stack_000024f0,in_stack_000024e8,in_stack_000024e4,in_stack_000024e3,
               in_stack_000024e2,in_stack_000024dc);
    break;
  case 9:
    av1_lowbd_inv_txfm2d_add_idtx_ssse3
              (in_stack_000000a0,in_stack_00000098,in_stack_00000094,in_stack_00000093);
    break;
  case 10:
  case 0xc:
  case 0xe:
    av1_lowbd_inv_txfm2d_add_h_identity_ssse3
              (in_stack_000004e0,in_stack_000004d8,in_stack_000004d4,in_stack_000004d3,
               in_stack_000004d2,in_stack_000004cc);
    break;
  case 0xb:
  case 0xd:
  case 0xf:
    av1_lowbd_inv_txfm2d_add_v_identity_ssse3
              (in_stack_000008e0,in_stack_000008d8,in_stack_000008d4,in_stack_000008d3,
               in_stack_000008d2,in_stack_000008cc);
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_universe_ssse3(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  switch (tx_type) {
    case DCT_DCT:
      lowbd_inv_txfm2d_add_no_identity_ssse3(input, output, stride, tx_type,
                                             tx_size, eob);
      break;
    case IDTX:
      av1_lowbd_inv_txfm2d_add_idtx_ssse3(input, output, stride, tx_size);
      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input, output, stride, tx_type,
                                                tx_size, eob);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input, output, stride, tx_type,
                                                tx_size, eob);
      break;
    default:
      lowbd_inv_txfm2d_add_no_identity_ssse3(input, output, stride, tx_type,
                                             tx_size, eob);
      break;
  }
}